

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O1

int coda_bin_cursor_get_num_elements(coda_cursor_conflict *cursor,long *num_elements)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  coda_type *pcVar5;
  long lVar6;
  ulong uVar7;
  long lStack_50;
  char acStack_48 [24];
  
  pcVar5 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar5->format) {
    pcVar5 = *(coda_type **)&pcVar5->type_class;
  }
  if (1 < pcVar5->type_class) {
    *num_elements = 1;
    return 0;
  }
  pcVar5 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar5->format) {
    pcVar5 = *(coda_type **)&pcVar5->type_class;
  }
  if (pcVar5->type_class == 1) {
    pcVar4 = *(char **)&pcVar5[1].type_class;
    if (pcVar4 == (char *)0xffffffffffffffff) {
      bVar1 = 0 < *(int *)&pcVar5[1].name;
      lVar6 = 1;
      if (0 < *(int *)&pcVar5[1].name) {
        uVar7 = 0;
        do {
          if ((&pcVar5[1].description)[uVar7] == (char *)0xffffffffffffffff) {
            iVar3 = coda_expression_eval_integer
                              ((coda_expression *)(&pcVar5[2].bit_size)[uVar7],cursor,&lStack_50);
            if (iVar3 == 0) {
              if (lStack_50 < 0) {
                coda_str64(lStack_50,acStack_48);
                coda_set_error(-300,
                               "product error detected (invalid array size - calculated array size = %s)"
                               ,acStack_48);
                goto LAB_0014f7fb;
              }
              lVar6 = lVar6 * lStack_50;
              bVar2 = true;
            }
            else {
              coda_add_error_message(" for dim[%d] expression",uVar7 & 0xffffffff);
LAB_0014f7fb:
              bVar2 = false;
              coda_cursor_add_to_error_message(cursor);
            }
            if (!bVar2) goto LAB_0014f858;
          }
          else {
            lVar6 = lVar6 * (long)(&pcVar5[1].description)[uVar7];
          }
          uVar7 = uVar7 + 1;
          bVar1 = (long)uVar7 < (long)*(int *)&pcVar5[1].name;
        } while ((long)uVar7 < (long)*(int *)&pcVar5[1].name);
      }
      *num_elements = lVar6;
LAB_0014f858:
      if (!bVar1) {
        return 0;
      }
      return -1;
    }
  }
  else {
    if (pcVar5->type_class != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)");
    }
    pcVar4 = pcVar5[1].name;
  }
  *num_elements = (long)pcVar4;
  return 0;
}

Assistant:

int coda_bin_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    switch (coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class)
    {
        case coda_array_class:
        case coda_record_class:
            return coda_ascbin_cursor_get_num_elements(cursor, num_elements);
        default:
            *num_elements = 1;  /* non-compound types type */
            break;
    }

    return 0;
}